

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  sqlite3 *db;
  int iVar1;
  Expr *pEVar2;
  ExprList_item *pEVar3;
  Expr *p;
  long lVar4;
  int iDummy;
  long local_50;
  int local_34;
  
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = (long)pList->nExpr;
    }
    if (0 < pAppend->nExpr) {
      lVar4 = 0;
      do {
        db = pParse->db;
        pEVar2 = pAppend->a[lVar4].pExpr;
        if (pEVar2 == (Expr *)0x0) {
          if (db->mallocFailed != '\0') {
            return pList;
          }
          if (bIntToNull != 0) {
LAB_0017cced:
            pEVar2 = (Expr *)0x0;
            goto LAB_0017ccf0;
          }
          pEVar2 = (Expr *)0x0;
        }
        else {
          pEVar2 = exprDup(db,pEVar2,0,(u8 **)0x0);
          if (db->mallocFailed != '\0') {
            if (pEVar2 == (Expr *)0x0) {
              return pList;
            }
            sqlite3ExprDeleteNN(db,pEVar2);
            return pList;
          }
          if (bIntToNull != 0) {
            p = pEVar2;
            if (pEVar2 == (Expr *)0x0) goto LAB_0017cced;
            do {
              if ((p->flags & 0x82000) == 0) goto LAB_0017ccf3;
              if ((p->flags >> 0x13 & 1) == 0) {
                pEVar3 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar3 = ((p->x).pList)->a;
              }
              p = pEVar3->pExpr;
            } while (pEVar3->pExpr != (Expr *)0x0);
LAB_0017ccf0:
            p = (Expr *)0x0;
LAB_0017ccf3:
            iVar1 = sqlite3ExprIsInteger(p,&local_34);
            if (iVar1 != 0) {
              p->op = 'y';
              p->flags = p->flags & 0xcffff7ff;
              (p->u).zToken = (char *)0x0;
            }
          }
        }
        pList = sqlite3ExprListAppend(pParse,pList,pEVar2);
        if (pList != (ExprList *)0x0) {
          pList->a[local_50 + lVar4].fg.sortFlags = pAppend->a[lVar4].fg.sortFlags;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pAppend->nExpr);
    }
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      assert( pDup==0 || !ExprHasProperty(pDup, EP_MemToken) );
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}